

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  
  test_add('T',0.0,0.0,0.0);
  test_add('T',0.0,1.0,1.0);
  test_add('T',1.0,0.0,1.0);
  test_add('T',1.0,1.0,0.0);
  test_add('i',42.0,-123.0,-81.0);
  test_add('c',65.0,32.0,97.0);
  test_add('h',4000000000.0,4000000000.0,8000000000.0);
  test_add('f',1.23,-100.0,-98.77);
  test_add('d',1.234523452345,-1.111111111111,0.1234123412341234);
  test_binary('T',rtosc_arg_val_mult,'*',0.0,0.0,0.0);
  test_binary('T',rtosc_arg_val_mult,'*',0.0,1.0,0.0);
  test_mult('T',1.0,0.0,0.0);
  test_mult('T',1.0,1.0,1.0);
  test_mult('i',-6.0,-7.0,42.0);
  test_mult('c',9.0,7.0,63.0);
  test_mult('h',3000000000.0,2.0,6000000000.0);
  test_mult('f',0.01,100.0,1.0);
  test_mult('f',1e+18,-1e-18,-1.0);
  test_mult('d',0.1111111,0.1111111,0.01234567654321);
  test_unary('T',rtosc_arg_val_negate,'-',1.0,0.0);
  test_unary('T',rtosc_arg_val_negate,'-',0.0,1.0);
  test_unary('F',rtosc_arg_val_negate,'-',1.0,0.0);
  test_unary('F',rtosc_arg_val_negate,'-',0.0,1.0);
  test_unary('i',rtosc_arg_val_negate,'-',123.0,-123.0);
  test_unary('h',rtosc_arg_val_negate,'-',8000000000.0,-8000000000.0);
  test_unary('f',rtosc_arg_val_negate,'-',-0.1234,0.1234);
  test_unary('f',rtosc_arg_val_negate,'-',0.0,0.0);
  test_unary('d',rtosc_arg_val_negate,'-',0.1234123412341234,-0.1234123412341234);
  test_unary('T',rtosc_arg_val_round,'~',1.0,1.0);
  test_unary('T',rtosc_arg_val_round,'~',0.0,0.0);
  test_unary('F',rtosc_arg_val_round,'~',1.0,1.0);
  test_unary('F',rtosc_arg_val_round,'~',0.0,0.0);
  test_unary('i',rtosc_arg_val_round,'~',123.0,123.0);
  test_unary('c',rtosc_arg_val_round,'~',-123.0,-123.0);
  test_unary('h',rtosc_arg_val_round,'~',-8000000000.0,-8000000000.0);
  test_unary('f',rtosc_arg_val_round,'~',-0.1234,0.0);
  test_unary('f',rtosc_arg_val_round,'~',9.989999771118164,9.0);
  test_unary('f',rtosc_arg_val_round,'~',9.999899864196777,10.0);
  test_unary('d',rtosc_arg_val_round,'~',1234.1234123412341,1234.0);
  test_unary('d',rtosc_arg_val_round,'~',9999.9999,10000.0);
  test_to_int('T',0.0);
  test_to_int('T',1.0);
  test_to_int('F',0.0);
  test_to_int('F',1.0);
  test_to_int('i',42.0);
  test_to_int('c',32.0);
  test_to_int('h',-80.0);
  test_to_int('f',0.12300000339746475);
  test_to_int('d',-0.12300000339746475);
  test_null('i');
  test_null('c');
  test_null('h');
  test_null('f');
  test_null('d');
  special_null_test();
  iVar1 = test_summary();
  return iVar1;
}

Assistant:

int main()
{
    test_add('T', 0, 0, 0);
    test_add('T', 0, 1, 1);
    test_add('T', 1, 0, 1);
    test_add('T', 1, 1, 0);
    test_add('i', 42, -123, -81);
    test_add('c', 'A', ' ', 'a');
    test_add('h', 4000000000, 4000000000, 8000000000);
    test_add('f', 1.23, -100, -98.77);
    test_add('d', 1.234523452345, -1.111111111111, 0.1234123412341234);

    // avoid division by '0' in test_mult('T', 0, 0, 0):
    test_binary('T', rtosc_arg_val_mult, '*', 0, 0, 0);
    test_binary('T', rtosc_arg_val_mult, '*', 0, 1, 0);
    test_mult('T', 1, 0, 0);
    test_mult('T', 1, 1, 1);
    test_mult('i', -6, -7, 42);
    test_mult('c', '\t', '\a', '?');
    test_mult('h', 3000000000, 2, 6000000000);
    test_mult('f', 0.01, 100, 1);
    test_mult('f', 1000000000000000000, -0.000000000000000001, -1);
    test_mult('d', 0.1111111, 0.1111111, 0.01234567654321);

    unary_arg_func_ptr op = rtosc_arg_val_negate;
    test_unary('T', op, '-', 1, 0);
    test_unary('T', op, '-', 0, 1);
    test_unary('F', op, '-', 1, 0);
    test_unary('F', op, '-', 0, 1);
    test_unary('i', op, '-', 123, -123);
    test_unary('h', op, '-', 8000000000, -8000000000);
    test_unary('f', op, '-', -0.1234, 0.1234);
    test_unary('f', op, '-', 0.0f, 0.0f);
    test_unary('d', op, '-', 0.1234123412341234, -0.1234123412341234);

    op = rtosc_arg_val_round;
    test_unary('T', op, '~', 1, 1);
    test_unary('T', op, '~', 0, 0);
    test_unary('F', op, '~', 1, 1);
    test_unary('F', op, '~', 0, 0);
    test_unary('i', op, '~', 123, 123);
    test_unary('c', op, '~', -123, -123);
    test_unary('h', op, '~', -8000000000, -8000000000);
    test_unary('f', op, '~', -0.1234, 0);
    test_unary('f', op, '~', 9.99f, 9);
    test_unary('f', op, '~', 9.9999f, 10);
    test_unary('d', op, '~', 1234.1234123412341234, 1234);
    test_unary('d', rtosc_arg_val_round, '~', 9999.9999, 10000);

    test_to_int('T', 0);
    test_to_int('T', 1);
    test_to_int('F', 0);
    test_to_int('F', 1);
    test_to_int('i', 42);
    test_to_int('c', ' ');
    test_to_int('h', -80);
    test_to_int('f', .123f);
    test_to_int('d', -.123f);

    test_null('i');
    test_null('c');
    test_null('h');
    test_null('f');
    test_null('d');

    special_null_test();

    // rtosc_arg_val_range_arg is being (indirectly)
    // tested in the pretty-format tests

    return test_summary();
}